

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

MPP_RET mpp_buffer_create(char *tag,char *caller,MppBufferGroupImpl *group,MppBufferInfo *info,
                         MppBufferImpl **buffer)

{
  RK_U32 *pRVar1;
  list_head *plVar2;
  RK_U32 RVar3;
  int iVar4;
  uint uVar5;
  list_head *plVar6;
  MppAllocatorApi *pMVar7;
  size_t sVar8;
  void *pvVar9;
  MppBufferType MVar10;
  undefined4 uVar11;
  MPP_RET MVar12;
  MppBufferImpl *buffer_00;
  MppBufferService *pMVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_34;
  
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_create");
  }
  if (group == (MppBufferGroupImpl *)0x0) {
    _mpp_log_l(2,"mpp_buffer","can not create buffer without group\n","mpp_buffer_create");
  }
  else {
    if ((group->limit_count != 0) && (group->limit_count <= group->buffer_count)) {
      MVar12 = MPP_NOK;
      if (group->log_runtime_en != 0) {
        _mpp_log_l(4,"mpp_buffer","group %d reach count limit %d\n","mpp_buffer_create",
                   (ulong)group->group_id);
      }
      goto LAB_00130cde;
    }
    if ((group->limit_size == 0) || (info->size <= group->limit_size)) {
      buffer_00 = (MppBufferImpl *)mpp_mem_pool_get_f(caller,mpp_buffer_pool);
      if (buffer_00 == (MppBufferImpl *)0x0) {
        _mpp_log_l(2,"mpp_buffer","failed to allocate context\n","mpp_buffer_create");
      }
      else {
        MVar12 = (*(&group->alloc_api->alloc)[(ulong)(group->mode != MPP_BUFFER_INTERNAL) * 2])
                           (group->allocator,info);
        if (MVar12 == MPP_OK) {
          if (tag == (char *)0x0) {
            tag = group->tag;
          }
          snprintf((char *)buffer_00,0x20,"%s",tag);
          buffer_00->caller = caller;
          pthread_mutexattr_init(&local_34);
          pthread_mutexattr_settype(&local_34,1);
          pthread_mutex_init((pthread_mutex_t *)&buffer_00->lock,&local_34);
          pthread_mutexattr_destroy(&local_34);
          pMVar7 = group->alloc_api;
          buffer_00->allocator = group->allocator;
          buffer_00->alloc_api = pMVar7;
          RVar3 = group->log_history_en;
          buffer_00->log_runtime_en = group->log_runtime_en;
          buffer_00->log_history_en = RVar3;
          buffer_00->group_id = group->group_id;
          MVar10 = group->type;
          buffer_00->mode = group->mode;
          buffer_00->type = MVar10;
          buffer_00->uncached =
               (uint)((group->flags & MPP_ALLOC_FLAG_CACHABLE) == MPP_ALLOC_FLAG_NONE);
          buffer_00->logs = group->logs;
          iVar4 = info->index;
          (buffer_00->info).fd = info->fd;
          (buffer_00->info).index = iVar4;
          MVar10 = info->type;
          uVar11 = *(undefined4 *)&info->field_0x4;
          sVar8 = info->size;
          pvVar9 = info->hnd;
          (buffer_00->info).ptr = info->ptr;
          (buffer_00->info).hnd = pvVar9;
          (buffer_00->info).type = MVar10;
          *(undefined4 *)&(buffer_00->info).field_0x4 = uVar11;
          (buffer_00->info).size = sVar8;
          pthread_mutex_lock((pthread_mutex_t *)&group->buf_lock);
          iVar4 = group->buffer_id;
          group->buffer_id = iVar4 + 1;
          buffer_00->buffer_id = iVar4;
          plVar2 = &buffer_00->list_status;
          (buffer_00->list_status).prev = plVar2;
          (buffer_00->list_maps).next = &buffer_00->list_maps;
          (buffer_00->list_maps).prev = &buffer_00->list_maps;
          if (buffer == (MppBufferImpl **)0x0) {
            plVar6 = (group->list_unused).prev;
            (group->list_unused).prev = plVar2;
            (buffer_00->list_status).next = &group->list_unused;
            (buffer_00->list_status).prev = plVar6;
            plVar6->next = plVar2;
            group->count_unused = group->count_unused + 1;
          }
          else {
            buffer_00->ref_count = buffer_00->ref_count + 1;
            buffer_00->used = 1;
            plVar6 = (group->list_used).prev;
            (group->list_used).prev = plVar2;
            (buffer_00->list_status).next = &group->list_used;
            (buffer_00->list_status).prev = plVar6;
            plVar6->next = plVar2;
            group->count_used = group->count_used + 1;
            *buffer = buffer_00;
          }
          group->usage = group->usage + info->size;
          group->buffer_count = group->buffer_count + 1;
          pthread_mutex_unlock((pthread_mutex_t *)&group->buf_lock);
          MVar12 = MPP_OK;
          buf_add_log(buffer_00,(group->mode == MPP_BUFFER_INTERNAL) + BUF_COMMIT,caller);
          if (group->mode == MPP_BUFFER_INTERNAL) {
            pMVar13 = MppBufferService::get_instance();
            iVar4 = (int)info->size;
            LOCK();
            pRVar1 = &pMVar13->total_size;
            RVar3 = *pRVar1;
            *pRVar1 = *pRVar1 + iVar4;
            UNLOCK();
            uVar14 = RVar3 + iVar4;
            do {
              uVar5 = pMVar13->total_max;
              uVar15 = uVar5;
              if (uVar5 < uVar14) {
                uVar15 = uVar14;
              }
              LOCK();
              bVar16 = uVar5 == pMVar13->total_max;
              if (bVar16) {
                pMVar13->total_max = uVar15;
              }
              UNLOCK();
            } while (!bVar16);
          }
          if (group->callback != (MppBufCallback)0x0) {
            (*group->callback)(group->arg,group);
          }
          goto LAB_00130cde;
        }
        _mpp_log_l(2,"mpp_buffer","failed to create buffer with size %d\n","mpp_buffer_create",
                   info->size);
        mpp_mem_pool_put_f(caller,mpp_buffer_pool,buffer_00);
      }
      MVar12 = MPP_ERR_MALLOC;
      goto LAB_00130cde;
    }
    _mpp_log_l(2,"mpp_buffer","required size %d reach group size limit %d\n","mpp_buffer_create");
  }
  MVar12 = MPP_NOK;
LAB_00130cde:
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_create");
  }
  return MVar12;
}

Assistant:

MPP_RET mpp_buffer_create(const char *tag, const char *caller,
                          MppBufferGroupImpl *group, MppBufferInfo *info,
                          MppBufferImpl **buffer)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = MPP_OK;
    BufferOp func = NULL;
    MppBufferImpl *p = NULL;

    if (NULL == group) {
        mpp_err_f("can not create buffer without group\n");
        ret = MPP_NOK;
        goto RET;
    }

    if (group->limit_count && group->buffer_count >= group->limit_count) {
        if (group->log_runtime_en)
            mpp_log_f("group %d reach count limit %d\n", group->group_id, group->limit_count);
        ret = MPP_NOK;
        goto RET;
    }

    if (group->limit_size && info->size > group->limit_size) {
        mpp_err_f("required size %d reach group size limit %d\n", info->size, group->limit_size);
        ret = MPP_NOK;
        goto RET;
    }

    p = (MppBufferImpl *)mpp_mem_pool_get_f(caller, mpp_buffer_pool);
    if (NULL == p) {
        mpp_err_f("failed to allocate context\n");
        ret = MPP_ERR_MALLOC;
        goto RET;
    }

    func = (group->mode == MPP_BUFFER_INTERNAL) ?
           (group->alloc_api->alloc) : (group->alloc_api->import);
    ret = func(group->allocator, info);
    if (ret) {
        mpp_err_f("failed to create buffer with size %d\n", info->size);
        mpp_mem_pool_put_f(caller, mpp_buffer_pool, p);
        ret = MPP_ERR_MALLOC;
        goto RET;
    }

    if (NULL == tag)
        tag = group->tag;

    snprintf(p->tag, sizeof(p->tag), "%s", tag);
    p->caller = caller;
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&p->lock, &attr);
    pthread_mutexattr_destroy(&attr);
    p->allocator = group->allocator;
    p->alloc_api = group->alloc_api;
    p->log_runtime_en = group->log_runtime_en;
    p->log_history_en = group->log_history_en;
    p->group_id = group->group_id;
    p->mode = group->mode;
    p->type = group->type;
    p->uncached = (group->flags & MPP_ALLOC_FLAG_CACHABLE) ? 0 : 1;
    p->logs = group->logs;
    p->info = *info;

    pthread_mutex_lock(&group->buf_lock);
    p->buffer_id = group->buffer_id++;
    INIT_LIST_HEAD(&p->list_status);
    INIT_LIST_HEAD(&p->list_maps);

    if (buffer) {
        p->ref_count++;
        p->used = 1;
        list_add_tail(&p->list_status, &group->list_used);
        group->count_used++;
        *buffer = p;
    } else {
        list_add_tail(&p->list_status, &group->list_unused);
        group->count_unused++;
    }

    group->usage += info->size;
    group->buffer_count++;
    pthread_mutex_unlock(&group->buf_lock);

    buf_add_log(p, (group->mode == MPP_BUFFER_INTERNAL) ? (BUF_CREATE) : (BUF_COMMIT), caller);

    if (group->mode == MPP_BUFFER_INTERNAL)
        MppBufferService::get_instance()->inc_total(info->size);

    if (group->callback)
        group->callback(group->arg, group);
RET:
    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}